

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O2

float Tim_ManGetCiArrival(Tim_Man_t *p,int iCi)

{
  float fVar1;
  Vec_Ptr_t *p_00;
  int iVar2;
  Tim_Obj_t *pTVar3;
  Tim_Obj_t *pTVar4;
  Tim_Box_t *pBox;
  float *pfVar5;
  Tim_Obj_t *pTVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float local_44;
  
  pTVar3 = Tim_ManCi(p,iCi);
  if (p->fUseTravId == 0) {
    iVar8 = p->nTravIds;
  }
  else {
    iVar8 = p->nTravIds;
    if (pTVar3->TravId == iVar8) goto LAB_003a0cdc;
  }
  pTVar3->TravId = iVar8;
  pTVar4 = Tim_ManCi(p,iCi);
  if (-1 < pTVar4->iObj2Box) {
    p_00 = p->vBoxes;
    pTVar4 = Tim_ManCi(p,iCi);
    pBox = (Tim_Box_t *)Vec_PtrEntry(p_00,pTVar4->iObj2Box);
    if (pBox != (Tim_Box_t *)0x0) {
      pBox->TravId = p->nTravIds;
      if (p->fUseTravId != 0) {
        iVar8 = 0;
        while ((iVar8 < pBox->nInputs &&
               (pTVar4 = Tim_ManBoxInput(p,pBox,iVar8), pTVar4 != (Tim_Obj_t *)0x0))) {
          if (pTVar4->TravId != p->nTravIds) {
            puts("Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!");
          }
          iVar8 = iVar8 + 1;
        }
      }
      pfVar5 = Tim_ManBoxDelayTable(p,pBox->iBox);
      iVar8 = 0;
      while ((iVar8 < pBox->nOutputs &&
             (pTVar4 = Tim_ManBoxOutput(p,pBox,iVar8), pTVar4 != (Tim_Obj_t *)0x0))) {
        iVar2 = pBox->nInputs;
        iVar7 = iVar2 * iVar8;
        lVar9 = 0;
        local_44 = -1e+09;
        while ((lVar9 < iVar2 &&
               (pTVar6 = Tim_ManBoxInput(p,pBox,(int)lVar9), pTVar6 != (Tim_Obj_t *)0x0))) {
          fVar1 = pfVar5[(long)iVar7 + lVar9 + 3];
          if ((fVar1 != -1e+09) || (NAN(fVar1))) {
            iVar2 = (int)(fVar1 + pTVar6->timeArr);
            if (iVar2 < (int)local_44) {
              iVar2 = (int)local_44;
            }
            local_44 = (float)iVar2;
          }
          lVar9 = lVar9 + 1;
          iVar2 = pBox->nInputs;
        }
        pTVar4->timeArr = local_44;
        pTVar4->TravId = p->nTravIds;
        iVar8 = iVar8 + 1;
      }
    }
  }
LAB_003a0cdc:
  return pTVar3->timeArr;
}

Assistant:

float Tim_ManGetCiArrival( Tim_Man_t * p, int iCi )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PI
    pObjThis = Tim_ManCi( p, iCi );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeArr;
    pObjThis->TravId = p->nTravIds;
    // consider the main PI
    pBox = Tim_ManCiBox( p, iCi );
    if ( pBox == NULL )
        return pObjThis->timeArr;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the arrival times of the inputs of the box (POs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachInput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!\n" );
    // compute the arrival times for each output of the box (PIs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachOutput( p, pBox, pObjRes, i )
    {
        pDelays = pTable + 3 + i * pBox->nInputs;
        DelayBest = -TIM_ETERNITY;
        Tim_ManBoxForEachInput( p, pBox, pObj, k )
			if ( pDelays[k] != -ABC_INFINITY )
				DelayBest = Abc_MaxInt( DelayBest, pObj->timeArr + pDelays[k] );
        pObjRes->timeArr = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeArr;
}